

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.cpp
# Opt level: O1

void __thiscall
GdlLanguageDefn::AddFeatureValue
          (GdlLanguageDefn *this,GdlFeatureDefn *pfeat,GdlFeatureSetting *pfset,int nFset,
          GrpLineAndFile *lnf)

{
  pointer *pppGVar1;
  pointer *pppGVar2;
  pointer ppGVar3;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  int local_5c;
  GdlFeatureSetting *local_58;
  GdlFeatureDefn *local_50;
  string local_48;
  
  ppGVar3 = (this->m_vpfeat).super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->m_vpfeat).
                super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppGVar3;
  bVar8 = lVar5 != 0;
  local_5c = nFset;
  local_58 = pfset;
  local_50 = pfeat;
  if (bVar8) {
    if (*ppGVar3 == pfeat) {
      uVar7 = 0;
    }
    else {
      uVar6 = lVar5 >> 3;
      uVar4 = 1;
      do {
        uVar7 = uVar4;
        bVar8 = uVar7 < uVar6;
        if (uVar6 <= uVar7) goto LAB_00159c23;
        uVar4 = (ulong)((int)uVar7 + 1);
      } while (ppGVar3[uVar7] != pfeat);
    }
    if ((this->m_vnFset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7] != nFset) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Duplicate language feature setting","");
      GrcErrorList::AddError(&g_errorList,0xc58,(GdlObject *)0x0,&local_48,lnf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar8) {
      return;
    }
  }
LAB_00159c23:
  __position._M_current =
       (this->m_vpfeat).super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_vpfeat).super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<GdlFeatureDefn*,std::allocator<GdlFeatureDefn*>>::
    _M_realloc_insert<GdlFeatureDefn*const&>
              ((vector<GdlFeatureDefn*,std::allocator<GdlFeatureDefn*>> *)&this->m_vpfeat,__position
               ,&local_50);
  }
  else {
    *__position._M_current = local_50;
    pppGVar1 = &(this->m_vpfeat).
                super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppGVar1 = *pppGVar1 + 1;
  }
  __position_00._M_current =
       (this->m_vpfset).
       super__Vector_base<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->m_vpfset).super__Vector_base<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<GdlFeatureSetting*,std::allocator<GdlFeatureSetting*>>::
    _M_realloc_insert<GdlFeatureSetting*const&>
              ((vector<GdlFeatureSetting*,std::allocator<GdlFeatureSetting*>> *)&this->m_vpfset,
               __position_00,&local_58);
  }
  else {
    *__position_00._M_current = local_58;
    pppGVar2 = &(this->m_vpfset).
                super__Vector_base<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppGVar2 = *pppGVar2 + 1;
  }
  __position_01._M_current =
       (this->m_vnFset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_01._M_current ==
      (this->m_vnFset).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->m_vnFset,__position_01,&local_5c);
  }
  else {
    *__position_01._M_current = local_5c;
    (this->m_vnFset).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position_01._M_current + 1;
  }
  return;
}

Assistant:

void GdlLanguageDefn::AddFeatureValue(GdlFeatureDefn * pfeat, GdlFeatureSetting * pfset,
	int nFset, GrpLineAndFile & lnf)
{
	for (auto ifeat = 0U; ifeat < m_vpfeat.size(); ++ifeat)
	{
		if (m_vpfeat[ifeat] == pfeat)
		{
			if (m_vnFset[ifeat] == nFset)
				return;
			else 
			{
				g_errorList.AddError(3160, NULL, "Duplicate language feature setting", lnf);
				return;
			}
		}
	}
	m_vpfeat.push_back(pfeat);
	m_vpfset.push_back(pfset);
	m_vnFset.push_back(nFset);
	Assert(m_vpfeat.size() == m_vpfset.size());
	Assert(m_vpfeat.size() == m_vnFset.size());
}